

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O0

int inclu2(int np,int nrbar,double weight,double *xnext,double *xrow,double ynext,double *d,
          double *rbar,double *thetab,double *ssqerr,double *recres,int *irank)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double rbthis;
  double xk;
  double sbar;
  double cbar;
  double dpi;
  double di;
  double xi;
  double wt;
  double y;
  int k;
  int i1;
  int ithisr;
  int i;
  int ifault;
  double *rbar_local;
  double *d_local;
  double ynext_local;
  double *xrow_local;
  double *xnext_local;
  double weight_local;
  int nrbar_local;
  int np_local;
  
  for (i1 = 0; i1 < np; i1 = i1 + 1) {
    xrow[i1] = xnext[i1];
  }
  *recres = 0.0;
  if (0.0 < weight) {
    k = 0;
    xi = weight;
    wt = ynext;
    for (i1 = 0; i1 < np; i1 = i1 + 1) {
      if ((xrow[i1] != 0.0) || (NAN(xrow[i1]))) {
        dVar6 = xrow[i1];
        dVar1 = d[i1];
        dVar4 = xi * dVar6 * dVar6 + dVar1;
        d[i1] = dVar4;
        dVar5 = dVar1 / dVar4;
        dVar4 = (xi * dVar6) / dVar4;
        xi = dVar5 * xi;
        y._4_4_ = i1;
        if (i1 != np + -1) {
          while (y._4_4_ = y._4_4_ + 1, y._4_4_ < np) {
            dVar2 = xrow[y._4_4_];
            dVar3 = rbar[k];
            xrow[y._4_4_] = -dVar6 * dVar3 + dVar2;
            rbar[k] = dVar5 * dVar3 + dVar4 * dVar2;
            k = k + 1;
          }
        }
        dVar6 = -dVar6 * thetab[i1] + wt;
        thetab[i1] = dVar5 * thetab[i1] + dVar4 * wt;
        wt = dVar6;
        if ((dVar1 == 0.0) && (!NAN(dVar1))) {
          *irank = *irank + 1;
          return 0;
        }
      }
      else {
        k = (np - i1) + -1 + k;
      }
    }
    *ssqerr = xi * wt * wt + *ssqerr;
    dVar6 = sqrt(xi);
    *recres = wt * dVar6;
    nrbar_local = 0;
  }
  else {
    nrbar_local = 1;
  }
  return nrbar_local;
}

Assistant:

static int inclu2(int np, int nrbar, double weight, double *xnext, double *xrow, double ynext,
	double *d, double *rbar, double *thetab,double *ssqerr,double *recres,int *irank) {
	int ifault,i,ithisr,i1,k;
	double y, wt,xi,di,dpi,cbar,sbar,xk,rbthis;

	y = ynext;
	wt = weight;

	for (i = 0; i < np; ++i) {
		xrow[i] = xnext[i];
	}

	*recres = 0.0;
	ifault = 1;
	if (wt <= 0.0) {
		return ifault;
	}
	ifault = 0;
	ithisr = 0;

	for (i = 0; i < np; ++i) {
		if (xrow[i] != 0.0) {
			xi = xrow[i];
			di = d[i];
			dpi = di + wt*xi*xi;
			d[i] = dpi;
			cbar = di / dpi;
			sbar = wt * xi / dpi;
			wt = cbar * wt;
			if (i != (np - 1)) {//40
				i1 = i + 1;
				for (k = i1; k < np; ++k) {
					xk = xrow[k];
					rbthis = rbar[ithisr];
					xrow[k] = xk - xi * rbthis;
					rbar[ithisr] = cbar * rbthis + sbar * xk;
					ithisr++;
				}
			}//40
			xk = y;
			y = xk - xi *thetab[i];
			thetab[i] = cbar * thetab[i] + sbar * xk;
			if (di == 0.0) {
				*irank = *irank + 1;
				return ifault;
			}
		}
		else {
			ithisr += (np - i - 1);
		}
	}
	*ssqerr = *ssqerr + wt*y*y;
	*recres = y * sqrt(wt);

	return ifault;
}